

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::DiscardOStream::DiscardOStream(DiscardOStream *this)

{
  std::ios_base::ios_base((ios_base *)&this->field_0x448);
  *(undefined8 *)&this->field_0x520 = 0;
  *(undefined2 *)&this->field_0x528 = 0;
  *(undefined8 *)&this->field_0x530 = 0;
  *(undefined8 *)&this->field_0x538 = 0;
  *(undefined8 *)&this->field_0x540 = 0;
  *(undefined8 *)&this->field_0x548 = 0;
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x165c00;
  *(undefined8 *)&this->field_0x448 = 0x165c28;
  std::ios::init((streambuf *)&this->field_0x448);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x165bb0;
  *(undefined8 *)&this->field_0x448 = 0x165bd8;
  *(code **)&(this->super_ostream).field_0x8 = sysconf;
  *(undefined8 *)&(this->super_ostream).field_0x10 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x18 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x20 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x28 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x30 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x38 = 0;
  std::locale::locale((locale *)&(this->super_ostream).field_0x40);
  *(undefined ***)&(this->super_ostream).field_0x8 = &PTR__streambuf_00165c60;
  return;
}

Assistant:

DiscardOStream()
            : std::ostream(&discardBuf) {}